

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

void __thiscall phyr::PathIntegrator::preprocess(PathIntegrator *this,Scene *scene,Sampler *sampler)

{
  LightDistribution *pLVar1;
  LightDistribution *pLVar2;
  LightDistribution *in_RAX;
  LightDistribution *local_18;
  
  local_18 = in_RAX;
  createLightSampleDistribution((phyr *)&local_18,&this->lightSampleStrategy,scene);
  pLVar2 = local_18;
  local_18 = (LightDistribution *)0x0;
  pLVar1 = (this->lightDistribution)._M_t.
           super___uniq_ptr_impl<phyr::LightDistribution,_std::default_delete<phyr::LightDistribution>_>
           ._M_t.
           super__Tuple_impl<0UL,_phyr::LightDistribution_*,_std::default_delete<phyr::LightDistribution>_>
           .super__Head_base<0UL,_phyr::LightDistribution_*,_false>._M_head_impl;
  (this->lightDistribution)._M_t.
  super___uniq_ptr_impl<phyr::LightDistribution,_std::default_delete<phyr::LightDistribution>_>._M_t
  .super__Tuple_impl<0UL,_phyr::LightDistribution_*,_std::default_delete<phyr::LightDistribution>_>.
  super__Head_base<0UL,_phyr::LightDistribution_*,_false>._M_head_impl = pLVar2;
  if (pLVar1 != (LightDistribution *)0x0) {
    (*pLVar1->_vptr_LightDistribution[1])();
    if (local_18 != (LightDistribution *)0x0) {
      (**(code **)(*(long *)local_18 + 8))();
    }
  }
  return;
}

Assistant:

void PathIntegrator::preprocess(const Scene& scene, Sampler& sampler) {
    lightDistribution = createLightSampleDistribution(lightSampleStrategy, scene);
}